

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

void __thiscall ConditionMarker::~ConditionMarker(ConditionMarker *this)

{
  Varnode *pVVar1;
  ConditionMarker *this_local;
  
  Varnode::clearMark(this->basevn);
  if (this->boolvn != (Varnode *)0x0) {
    Varnode::clearMark(this->boolvn);
  }
  if (this->bool2vn != (Varnode *)0x0) {
    Varnode::clearMark(this->bool2vn);
  }
  if (this->bool3vn != (Varnode *)0x0) {
    Varnode::clearMark(this->bool3vn);
  }
  if (this->binaryop != (PcodeOp *)0x0) {
    pVVar1 = PcodeOp::getIn(this->binaryop,0);
    Varnode::clearMark(pVVar1);
    pVVar1 = PcodeOp::getIn(this->binaryop,1);
    Varnode::clearMark(pVVar1);
  }
  return;
}

Assistant:

ConditionMarker::~ConditionMarker(void)

{
  basevn->clearMark();
  if (boolvn != (Varnode *)0)
    boolvn->clearMark();
  if (bool2vn != (Varnode *)0)
    bool2vn->clearMark();
  if (bool3vn != (Varnode *)0)
    bool3vn->clearMark();
  if (binaryop != (PcodeOp *)0) {
    binaryop->getIn(0)->clearMark();
    binaryop->getIn(1)->clearMark();
  }
}